

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

Json __thiscall YdiskRestClient::get_disk_info(YdiskRestClient *this)

{
  SSLClient *path;
  code *pcVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  YdiskRestClient *in_RSI;
  Json JVar4;
  string local_b0;
  Json local_90;
  undefined1 local_79;
  string local_78 [8];
  string error;
  function<bool_(unsigned_long,_unsigned_long)> local_48;
  undefined1 local_28 [8];
  shared_ptr<httplib::Response> r;
  YdiskRestClient *this_local;
  Json *json;
  
  path = in_RSI->http_client;
  std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_48,(nullptr_t)0x0);
  httplib::Client::Get
            ((Client *)local_28,(char *)path,(Headers *)"/v1/disk/",(Progress *)&in_RSI->headers);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_48);
  peVar2 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  if ((peVar2 != (element_type *)0x0) &&
     (peVar3 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28), peVar3->status == 200)) {
    std::__cxx11::string::string(local_78);
    local_79 = 0;
    peVar3 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    json11::Json::parse((string *)this,&peVar3->body,(JsonParse)local_78);
    json11::Json::Json(&local_90,(Json *)this);
    std::__cxx11::string::string((string *)&local_b0,local_78);
    check_parsing_result(in_RSI,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    json11::Json::~Json(&local_90);
    local_79 = 1;
    std::__cxx11::string::~string(local_78);
    std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_28);
    JVar4.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    JVar4.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Json)JVar4.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  peVar2 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  throw_response_error(in_RSI,peVar2);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Json YdiskRestClient::get_disk_info()
{
    auto r = http_client->Get("/v1/disk/", headers);

    if(r.get() && r->status==200){
        std::string error;
        auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        return json;
    } else {
        throw_response_error(r.get());
    }
}